

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O1

REF_STATUS ref_node_tet_quality(REF_NODE ref_node,REF_INT *nodes,REF_DBL *quality)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  REF_DBL *pRVar5;
  uint uVar6;
  long lVar7;
  undefined8 uVar8;
  char *pcVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  REF_DBL det;
  REF_DBL volume;
  REF_DBL det_1;
  REF_DBL e5 [3];
  REF_DBL e4 [3];
  REF_DBL e3 [3];
  REF_DBL e2 [3];
  REF_DBL jac [9];
  REF_DBL l5;
  REF_DBL l4;
  REF_DBL l3;
  REF_DBL l2;
  REF_DBL l1;
  REF_DBL l0;
  double local_318 [4];
  double local_2f8;
  double local_2f0;
  double local_2e8;
  double local_2e0;
  double local_2d8;
  double local_2d0;
  double local_2c8;
  double local_2c0;
  double local_2b8;
  double local_2b0;
  double local_2a8;
  double local_2a0;
  double local_298;
  double local_290;
  double local_288;
  double local_280;
  double local_278;
  double local_270;
  double local_268 [4];
  double local_248;
  double local_240;
  double local_238;
  double local_230;
  double local_228;
  double local_220;
  double local_218 [4];
  double local_1f8 [4];
  double local_1d8 [4];
  double local_1b8 [4];
  REF_DBL local_198 [10];
  double local_148;
  double local_140;
  double local_138;
  double local_130;
  double local_128;
  double local_120;
  double local_118 [6];
  double local_e8 [6];
  double local_b8 [6];
  double local_88 [6];
  double local_58 [6];
  
  if (ref_node->tet_quality != 2) {
    if (ref_node->tet_quality != 1) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x7a7,
             "ref_node_tet_quality","case not recognized");
      return 1;
    }
    uVar6 = ref_node_tet_vol(ref_node,nodes,local_268);
    if (uVar6 == 0) {
      if (local_268[0] <= ref_node->min_volume) {
        *quality = local_268[0] - ref_node->min_volume;
LAB_0017118f:
        uVar6 = 0;
      }
      else {
        uVar6 = ref_node_ratio(ref_node,*nodes,nodes[1],local_58);
        if (uVar6 == 0) {
          uVar6 = ref_node_ratio(ref_node,*nodes,nodes[2],local_88);
          if (uVar6 == 0) {
            uVar6 = ref_node_ratio(ref_node,*nodes,nodes[3],local_b8);
            if (uVar6 == 0) {
              uVar6 = ref_node_ratio(ref_node,nodes[1],nodes[2],local_e8);
              if (uVar6 == 0) {
                uVar6 = ref_node_ratio(ref_node,nodes[1],nodes[3],local_118);
                if (uVar6 == 0) {
                  uVar6 = ref_node_ratio(ref_node,nodes[2],nodes[3],&local_148);
                  if (uVar6 == 0) {
                    iVar1 = *nodes;
                    pRVar5 = ref_node->real;
                    lVar7 = 0;
                    do {
                      local_198[lVar7] = pRVar5[iVar1 * 0xf + 3 + (int)lVar7];
                      lVar7 = lVar7 + 1;
                    } while (lVar7 != 6);
                    uVar6 = ref_matrix_det_m(local_198,local_318);
                    dVar10 = local_318[0];
                    if (uVar6 == 0) {
                      iVar1 = nodes[1];
                      pRVar5 = ref_node->real;
                      lVar7 = 0;
                      do {
                        local_198[lVar7] = pRVar5[iVar1 * 0xf + 3 + (int)lVar7];
                        lVar7 = lVar7 + 1;
                      } while (lVar7 != 6);
                      uVar6 = ref_matrix_det_m(local_198,local_318);
                      dVar11 = local_318[0];
                      if (uVar6 == 0) {
                        iVar1 = nodes[2];
                        pRVar5 = ref_node->real;
                        lVar7 = 0;
                        do {
                          local_198[lVar7] = pRVar5[iVar1 * 0xf + 3 + (int)lVar7];
                          lVar7 = lVar7 + 1;
                        } while (lVar7 != 6);
                        uVar6 = ref_matrix_det_m(local_198,local_318);
                        dVar12 = local_318[0];
                        if (uVar6 == 0) {
                          if (dVar11 <= dVar10) {
                            dVar10 = dVar11;
                          }
                          iVar1 = nodes[3];
                          pRVar5 = ref_node->real;
                          lVar7 = 0;
                          do {
                            local_198[lVar7] = pRVar5[iVar1 * 0xf + 3 + (int)lVar7];
                            lVar7 = lVar7 + 1;
                          } while (lVar7 != 6);
                          uVar6 = ref_matrix_det_m(local_198,local_318);
                          if (uVar6 == 0) {
                            if (dVar12 <= dVar10) {
                              dVar10 = dVar12;
                            }
                            if (local_318[0] <= dVar10) {
                              dVar10 = local_318[0];
                            }
                            if (dVar10 < 0.0) {
                              dVar10 = sqrt(dVar10);
                            }
                            else {
                              dVar10 = SQRT(dVar10);
                            }
                            dVar11 = pow(local_268[0] * dVar10,0.6666666666666666);
                            dVar12 = local_148 * local_148 +
                                     local_118[0] * local_118[0] +
                                     local_e8[0] * local_e8[0] +
                                     local_b8[0] * local_b8[0] +
                                     local_58[0] * local_58[0] + local_88[0] * local_88[0];
                            dVar10 = dVar12 * 1e+20;
                            if (dVar10 <= -dVar10) {
                              dVar10 = -dVar10;
                            }
                            dVar13 = dVar11;
                            if (dVar11 <= -dVar11) {
                              dVar13 = -dVar11;
                            }
                            *quality = (REF_DBL)(~-(ulong)(dVar13 < dVar10) & 0xbff0000000000000 |
                                                (ulong)((dVar11 * 24.9610058766228) / dVar12) &
                                                -(ulong)(dVar13 < dVar10));
                            goto LAB_0017118f;
                          }
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                                 ,0x693,"ref_node_tet_epic_quality",(ulong)uVar6,"n3");
                        }
                        else {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                                 ,0x68f,"ref_node_tet_epic_quality",(ulong)uVar6,"n2");
                        }
                      }
                      else {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                               ,0x68b,"ref_node_tet_epic_quality",(ulong)uVar6,"n1");
                      }
                    }
                    else {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                             ,0x687,"ref_node_tet_epic_quality",(ulong)uVar6,"n0");
                    }
                  }
                  else {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                           ,0x684,"ref_node_tet_epic_quality",(ulong)uVar6,"l5");
                  }
                }
                else {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                         ,0x683,"ref_node_tet_epic_quality",(ulong)uVar6,"l4");
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                       ,0x682,"ref_node_tet_epic_quality",(ulong)uVar6,"l3");
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                     ,0x681,"ref_node_tet_epic_quality",(ulong)uVar6,"l2");
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
                   0x680,"ref_node_tet_epic_quality",(ulong)uVar6,"l1");
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
                 0x67f,"ref_node_tet_epic_quality",(ulong)uVar6,"l0");
        }
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x678,
             "ref_node_tet_epic_quality",(ulong)uVar6,"vol");
    }
    if (uVar6 == 0) {
      return 0;
    }
    pcVar9 = "epic";
    uVar8 = 0x7a1;
    goto LAB_001711e7;
  }
  uVar6 = ref_node_tet_vol(ref_node,nodes,&local_228);
  if (uVar6 == 0) {
    if (local_228 <= ref_node->min_volume) {
      *quality = local_228 - ref_node->min_volume;
LAB_001711c0:
      uVar6 = 0;
    }
    else {
      iVar1 = *nodes;
      pRVar5 = ref_node->real;
      lVar7 = 0;
      do {
        local_58[lVar7] = pRVar5[iVar1 * 0xf + 9 + (int)lVar7];
        lVar7 = lVar7 + 1;
      } while (lVar7 != 6);
      iVar1 = nodes[1];
      lVar7 = 0;
      do {
        local_88[lVar7] = pRVar5[iVar1 * 0xf + 9 + (int)lVar7];
        lVar7 = lVar7 + 1;
      } while (lVar7 != 6);
      iVar1 = nodes[2];
      lVar7 = 0;
      do {
        local_b8[lVar7] = pRVar5[iVar1 * 0xf + 9 + (int)lVar7];
        lVar7 = lVar7 + 1;
      } while (lVar7 != 6);
      iVar1 = nodes[3];
      lVar7 = 0;
      do {
        local_e8[lVar7] = pRVar5[iVar1 * 0xf + 9 + (int)lVar7];
        lVar7 = lVar7 + 1;
      } while (lVar7 != 6);
      lVar7 = 0;
      do {
        local_118[lVar7] =
             (local_58[lVar7] + local_88[lVar7] + local_b8[lVar7] + local_e8[lVar7]) * 0.25;
        lVar7 = lVar7 + 1;
      } while (lVar7 != 6);
      uVar6 = ref_matrix_exp_m(local_118,&local_148);
      if (uVar6 == 0) {
        uVar6 = ref_matrix_jacob_m(&local_148,local_198);
        if (uVar6 == 0) {
          pRVar5 = ref_node->real;
          iVar1 = nodes[1];
          iVar2 = *nodes;
          lVar7 = 0;
          do {
            local_318[lVar7] = pRVar5[(long)iVar1 * 0xf + lVar7] - pRVar5[(long)iVar2 * 0xf + lVar7]
            ;
            lVar7 = lVar7 + 1;
          } while (lVar7 != 3);
          iVar3 = nodes[2];
          lVar7 = 0;
          do {
            local_268[lVar7] = pRVar5[(long)iVar3 * 0xf + lVar7] - pRVar5[(long)iVar2 * 0xf + lVar7]
            ;
            lVar7 = lVar7 + 1;
          } while (lVar7 != 3);
          iVar4 = nodes[3];
          lVar7 = 0;
          do {
            local_1b8[lVar7] = pRVar5[(long)iVar4 * 0xf + lVar7] - pRVar5[(long)iVar2 * 0xf + lVar7]
            ;
            lVar7 = lVar7 + 1;
          } while (lVar7 != 3);
          lVar7 = 0;
          do {
            local_1d8[lVar7] = pRVar5[(long)iVar3 * 0xf + lVar7] - pRVar5[(long)iVar1 * 0xf + lVar7]
            ;
            lVar7 = lVar7 + 1;
          } while (lVar7 != 3);
          lVar7 = 0;
          do {
            local_1f8[lVar7] = pRVar5[(long)iVar4 * 0xf + lVar7] - pRVar5[(long)iVar1 * 0xf + lVar7]
            ;
            lVar7 = lVar7 + 1;
          } while (lVar7 != 3);
          lVar7 = 0;
          do {
            local_218[lVar7] = pRVar5[(long)iVar4 * 0xf + lVar7] - pRVar5[(long)iVar3 * 0xf + lVar7]
            ;
            lVar7 = lVar7 + 1;
          } while (lVar7 != 3);
          local_248 = local_140;
          local_298 = local_318[0];
          local_2a8 = local_318[1];
          local_230 = local_138;
          local_2f0 = local_318[2];
          local_2b8 = local_120;
          local_2a0 = local_268[0];
          local_2b0 = local_268[1];
          local_290 = local_268[2];
          local_280 = local_1b8[0];
          local_288 = local_1b8[1];
          local_2e8 = local_1b8[2];
          local_2d8 = local_1d8[0];
          local_2e0 = local_1d8[1];
          local_2d0 = local_1d8[2];
          local_2c0 = local_1f8[0];
          local_2c8 = local_1f8[1];
          local_278 = local_1f8[2];
          local_270 = local_218[0];
          local_240 = local_218[1];
          local_238 = local_218[2];
          uVar6 = ref_matrix_det_m(&local_148,&local_220);
          if (uVar6 == 0) {
            local_318[3] = (local_230 * local_2f0 + local_148 * local_298 + local_248 * local_2a8) *
                           local_298 +
                           (local_128 * local_2f0 + local_248 * local_298 + local_2a8 * local_130) *
                           local_2a8;
            local_2f8 = (local_230 * local_2e8 + local_148 * local_280 + local_248 * local_288) *
                        local_280 +
                        (local_128 * local_2e8 + local_248 * local_280 + local_130 * local_288) *
                        local_288;
            local_2b8 = (local_2b8 * local_238 + local_230 * local_270 + local_128 * local_240) *
                        local_238 +
                        (local_230 * local_238 + local_148 * local_270 + local_248 * local_240) *
                        local_270 +
                        (local_128 * local_238 + local_248 * local_270 + local_130 * local_240) *
                        local_240 +
                        (local_2b8 * local_278 + local_230 * local_2c0 + local_128 * local_2c8) *
                        local_278 +
                        (local_230 * local_278 + local_148 * local_2c0 + local_248 * local_2c8) *
                        local_2c0 +
                        (local_128 * local_278 + local_248 * local_2c0 + local_130 * local_2c8) *
                        local_2c8 +
                        (local_2b8 * local_2d0 + local_230 * local_2d8 + local_128 * local_2e0) *
                        local_2d0 +
                        (local_230 * local_2d0 + local_148 * local_2d8 + local_248 * local_2e0) *
                        local_2d8 +
                        (local_128 * local_2d0 + local_248 * local_2d8 + local_130 * local_2e0) *
                        local_2e0 +
                        (local_2b8 * local_2e8 + local_230 * local_280 + local_128 * local_288) *
                        local_2e8 + local_2f8 +
                        (local_2b8 * local_290 + local_230 * local_2a0 + local_128 * local_2b0) *
                        local_290 +
                        (local_230 * local_290 + local_148 * local_2a0 + local_248 * local_2b0) *
                        local_2a0 +
                        (local_128 * local_290 + local_248 * local_2a0 + local_130 * local_2b0) *
                        local_2b0 +
                        (local_2b8 * local_2f0 + local_230 * local_298 + local_2a8 * local_128) *
                        local_2f0 + local_318[3];
            if (local_220 < 0.0) {
              local_220 = sqrt(local_220);
            }
            else {
              local_220 = SQRT(local_220);
            }
            dVar11 = pow(local_228 * local_220,0.6666666666666666);
            dVar10 = local_2b8 * 1e+20;
            if (dVar10 <= -dVar10) {
              dVar10 = -dVar10;
            }
            dVar12 = dVar11;
            if (dVar11 <= -dVar11) {
              dVar12 = -dVar11;
            }
            *quality = (REF_DBL)(~-(ulong)(dVar12 < dVar10) & 0xbff0000000000000 |
                                (ulong)((dVar11 * 24.9610058766228) / local_2b8) &
                                -(ulong)(dVar12 < dVar10));
            goto LAB_001711c0;
          }
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
                 0x78d,"ref_node_tet_jac_quality",(ulong)uVar6,"det(mavg)");
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
                 0x774,"ref_node_tet_jac_quality",(ulong)uVar6,"jac");
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
               0x773,"ref_node_tet_jac_quality",(ulong)uVar6,"exp");
      }
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x767,
           "ref_node_tet_jac_quality",(ulong)uVar6,"vol");
  }
  if (uVar6 == 0) {
    return 0;
  }
  pcVar9 = "jac";
  uVar8 = 0x7a4;
LAB_001711e7:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",uVar8,
         "ref_node_tet_quality",(ulong)uVar6,pcVar9);
  return uVar6;
}

Assistant:

REF_FCN REF_STATUS ref_node_tet_quality(REF_NODE ref_node, REF_INT *nodes,
                                        REF_DBL *quality) {
  switch (ref_node->tet_quality) {
    case REF_NODE_EPIC_QUALITY:
      RSS(ref_node_tet_epic_quality(ref_node, nodes, quality), "epic");
      break;
    case REF_NODE_JAC_QUALITY:
      RSS(ref_node_tet_jac_quality(ref_node, nodes, quality), "jac");
      break;
    default:
      THROW("case not recognized");
  }
  return REF_SUCCESS;
}